

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

void enet_host_bandwidth_throttle(ENetHost *host)

{
  uint uVar1;
  ENetPeer **ppEVar2;
  ENetPeer *pEVar3;
  bool bVar4;
  enet_uint32 eVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  uint uVar18;
  ENetProtocol local_62;
  
  eVar5 = enet_time_get();
  uVar13 = eVar5 - host->bandwidthThrottleEpoch;
  if (uVar13 < 1000) {
    return;
  }
  uVar15 = (uint)host->connectedPeers;
  host->bandwidthThrottleEpoch = eVar5;
  if (uVar15 == 0) {
    return;
  }
  if (host->outgoingBandwidth == 0) {
    uVar14 = 0xffffffff;
    uVar7 = 0xffffffff;
  }
  else {
    uVar7 = (host->outgoingBandwidth * uVar13) / 1000;
    if (host->peerCount == 0) {
      uVar14 = 0;
    }
    else {
      sVar12 = 0;
      uVar14 = 0;
      do {
        if (host->peer_list[sVar12]->state - ENET_PEER_STATE_CONNECTED < 2) {
          uVar14 = uVar14 + host->peer_list[sVar12]->outgoingDataTotal;
        }
        sVar12 = sVar12 + 1;
      } while (host->peerCount != sVar12);
    }
  }
  if (host->bandwidthLimitedPeers != 0) {
    sVar12 = host->peerCount;
    uVar18 = uVar15;
    while( true ) {
      uVar10 = 0x20;
      if (uVar7 < uVar14) {
        uVar10 = (uVar7 << 5) / uVar14;
      }
      if (sVar12 == 0) break;
      ppEVar2 = host->peer_list;
      sVar17 = 0;
      bVar4 = false;
      do {
        pEVar3 = ppEVar2[sVar17];
        if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) && (pEVar3->incomingBandwidth != 0)) &&
           (pEVar3->outgoingBandwidthThrottleEpoch != eVar5)) {
          uVar8 = pEVar3->incomingBandwidth * uVar13;
          uVar1 = pEVar3->outgoingDataTotal;
          if (uVar8 / 1000 < uVar1 * uVar10 >> 5) {
            uVar8 = uVar8 / 1000;
            uVar6 = (uVar8 << 5) / uVar1;
            if (uVar8 << 5 < uVar1) {
              uVar6 = 1;
            }
            pEVar3->packetThrottleLimit = uVar6;
            if (uVar6 < pEVar3->packetThrottle) {
              pEVar3->packetThrottle = uVar6;
            }
            pEVar3->outgoingBandwidthThrottleEpoch = eVar5;
            pEVar3->incomingDataTotal = 0;
            pEVar3->outgoingDataTotal = 0;
            uVar18 = uVar18 - 1;
            uVar7 = uVar7 - uVar8;
            uVar14 = uVar14 - uVar8;
            bVar4 = true;
          }
        }
        sVar17 = sVar17 + 1;
      } while (sVar12 != sVar17);
      if ((uVar18 == 0) || (!bVar4)) break;
    }
    if (uVar18 == 0) goto LAB_00103e24;
  }
  uVar13 = 0x20;
  if (uVar7 < uVar14) {
    uVar13 = (uVar7 << 5) / uVar14;
  }
  sVar12 = host->peerCount;
  if (sVar12 != 0) {
    ppEVar2 = host->peer_list;
    sVar17 = 0;
    do {
      pEVar3 = ppEVar2[sVar17];
      if ((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
         (pEVar3->outgoingBandwidthThrottleEpoch != eVar5)) {
        pEVar3->packetThrottleLimit = uVar13;
        if (uVar13 < pEVar3->packetThrottle) {
          pEVar3->packetThrottle = uVar13;
        }
        pEVar3->incomingDataTotal = 0;
        pEVar3->outgoingDataTotal = 0;
      }
      sVar17 = sVar17 + 1;
    } while (sVar12 != sVar17);
  }
LAB_00103e24:
  if (host->recalculateBandwidthLimits != 0) {
    host->recalculateBandwidthLimits = 0;
    uVar16 = (ulong)host->incomingBandwidth;
    uVar11 = host->peerCount;
    if (host->incomingBandwidth == 0) {
      uVar13 = 0;
      if (uVar11 == 0) {
        return;
      }
    }
    else {
      do {
        if (uVar11 == 0) {
          return;
        }
        uVar13 = (uint)(uVar16 / uVar15);
        ppEVar2 = host->peer_list;
        uVar9 = 0;
        bVar4 = false;
        do {
          pEVar3 = ppEVar2[uVar9];
          if (((pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) &&
              (pEVar3->incomingBandwidthThrottleEpoch != eVar5)) &&
             ((uVar7 = pEVar3->outgoingBandwidth, uVar7 == 0 || (uVar7 < uVar13)))) {
            pEVar3->incomingBandwidthThrottleEpoch = eVar5;
            uVar15 = uVar15 - 1;
            uVar16 = (ulong)((int)uVar16 - uVar7);
            bVar4 = true;
          }
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      } while ((uVar15 != 0) && (bVar4));
    }
    uVar16 = 0;
    do {
      pEVar3 = host->peer_list[uVar16];
      if (pEVar3->state - ENET_PEER_STATE_CONNECTED < 2) {
        local_62._0_2_ = 0xff8a;
        uVar15 = host->outgoingBandwidth;
        local_62.sendFragment.fragmentCount =
             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
        local_62.connect.outgoingPeerID =
             uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
        if (pEVar3->incomingBandwidthThrottleEpoch == eVar5) {
          uVar15 = pEVar3->outgoingBandwidth;
          local_62.connect.outgoingPeerID =
               uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
        }
        enet_peer_queue_outgoing_command(pEVar3,&local_62,(ENetPacket *)0x0,0,0);
        uVar11 = host->peerCount;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar11);
  }
  return;
}

Assistant:

void
enet_host_bandwidth_throttle (ENetHost * host)
{
    enet_uint32 timeCurrent = enet_time_get (),
           elapsedTime = timeCurrent - host -> bandwidthThrottleEpoch,
           peersRemaining = (enet_uint32) host -> connectedPeers,
           dataTotal = ~0,
           bandwidth = ~0,
           throttle = 0,
           bandwidthLimit = 0;
    int needsAdjustment = host -> bandwidthLimitedPeers > 0 ? 1 : 0;
    ENetPeer * peer;
    ENetProtocol command;
    int i;

    if (elapsedTime < ENET_HOST_BANDWIDTH_THROTTLE_INTERVAL)
      return;

    host -> bandwidthThrottleEpoch = timeCurrent;

    if (peersRemaining == 0)
      return;

    if (host -> outgoingBandwidth != 0)
    {
        dataTotal = 0;
        bandwidth = (host -> outgoingBandwidth * elapsedTime) / 1000;

	for (i = 0; i < host -> peerCount; i++ )
        {
	    peer = host -> peer_list[i];

            if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
              continue;

            dataTotal += peer -> outgoingDataTotal;
        }
    }

    while (peersRemaining > 0 && needsAdjustment != 0)
    {
        needsAdjustment = 0;
        
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
            enet_uint32 peerBandwidth;
	    peer = host -> peer_list[i];
            
            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                peer -> incomingBandwidth == 0 ||
                peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
              continue;

            peerBandwidth = (peer -> incomingBandwidth * elapsedTime) / 1000;
            if ((throttle * peer -> outgoingDataTotal) / ENET_PEER_PACKET_THROTTLE_SCALE <= peerBandwidth)
              continue;

            peer -> packetThrottleLimit = (peerBandwidth * 
                                            ENET_PEER_PACKET_THROTTLE_SCALE) / peer -> outgoingDataTotal;
            
            if (peer -> packetThrottleLimit == 0)
              peer -> packetThrottleLimit = 1;
            
            if (peer -> packetThrottle > peer -> packetThrottleLimit)
              peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> outgoingBandwidthThrottleEpoch = timeCurrent;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;

            needsAdjustment = 1;
            -- peersRemaining;
            bandwidth -= peerBandwidth;
            dataTotal -= peerBandwidth;
        }
    }

    if (peersRemaining > 0)
    {
        if (dataTotal <= bandwidth)
          throttle = ENET_PEER_PACKET_THROTTLE_SCALE;
        else
          throttle = (bandwidth * ENET_PEER_PACKET_THROTTLE_SCALE) / dataTotal;

	for (i = 0; i < host -> peerCount; i++ )
	{
	    peer = host -> peer_list[i];

            if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
		peer -> outgoingBandwidthThrottleEpoch == timeCurrent)
	      continue;

	    peer -> packetThrottleLimit = throttle;

	    if (peer -> packetThrottle > peer -> packetThrottleLimit)
		peer -> packetThrottle = peer -> packetThrottleLimit;

            peer -> incomingDataTotal = 0;
            peer -> outgoingDataTotal = 0;
	}
    }

    if (host -> recalculateBandwidthLimits)
    {
       host -> recalculateBandwidthLimits = 0;

       peersRemaining = (enet_uint32) host -> connectedPeers;
       bandwidth = host -> incomingBandwidth;
       needsAdjustment = 1;

       if (bandwidth == 0)
         bandwidthLimit = 0;
       else
       while (peersRemaining > 0 && needsAdjustment != 0)
       {
           needsAdjustment = 0;
           bandwidthLimit = bandwidth / peersRemaining;

	   for (i = 0; i < host -> peerCount; i++ )
	   {
	       peer = host -> peer_list[i];
               if ((peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER) ||
                   peer -> incomingBandwidthThrottleEpoch == timeCurrent)
                 continue;

               if (peer -> outgoingBandwidth > 0 &&
                   peer -> outgoingBandwidth >= bandwidthLimit)
                 continue;

               peer -> incomingBandwidthThrottleEpoch = timeCurrent;
 
               needsAdjustment = 1;
               -- peersRemaining;
               bandwidth -= peer -> outgoingBandwidth;
           }
       }

       for (i = 0; i < host -> peerCount; i++ )
       {
	   peer = host -> peer_list[i];

           if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
             continue;

           command.header.command = ENET_PROTOCOL_COMMAND_BANDWIDTH_LIMIT | ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE;
           command.header.channelID = 0xFF;
           command.bandwidthLimit.outgoingBandwidth = ENET_HOST_TO_NET_32 (host -> outgoingBandwidth);

           if (peer -> incomingBandwidthThrottleEpoch == timeCurrent)
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (peer -> outgoingBandwidth);
           else
             command.bandwidthLimit.incomingBandwidth = ENET_HOST_TO_NET_32 (bandwidthLimit);

           enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);
       } 
    }
}